

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectiveParser.cpp
# Opt level: O0

bool __thiscall Refal2::CDirectiveParser::StartParseIfDirective(CDirectiveParser *this)

{
  TDirectiveType TVar1;
  TDirectiveType directiveType;
  CDirectiveParser *this_local;
  
  if ((this->super_CRuleParser).super_CQualifierParser.token.type == TT_Word) {
    TVar1 = findDirective(&(this->super_CRuleParser).super_CQualifierParser.token.word);
    if (TVar1 == DT_None) {
      this_local._7_1_ = false;
    }
    else {
      CRuleParser::EndFunction(&this->super_CRuleParser);
      CParsingElementState::Reset
                (&(this->super_CRuleParser).super_CQualifierParser.super_CParsingElementState);
      CToken::Move(&(this->super_CRuleParser).super_CQualifierParser.token,&this->directive);
      switch(TVar1) {
      case DT_Start:
        this->state = S_Simple;
        CModuleBuilder::StartModule((CModuleBuilder *)this,&this->directive);
        break;
      case DT_End:
        this->state = S_Simple;
        CModuleBuilder::EndModule((CModuleBuilder *)this,&this->directive);
        break;
      case DT_Empty:
        this->state = S_OneName;
        this->handler = (THandler)addEmpty;
        *(undefined8 *)&this->field_0x1ef0 = 0;
        break;
      case DT_External:
        this->state = S_TwoNames;
        this->handler = (THandler)addExternal;
        *(undefined8 *)&this->field_0x1ef0 = 0;
        break;
      case DT_Entry:
        this->state = S_TwoNames;
        this->handler = (THandler)addEntry;
        *(undefined8 *)&this->field_0x1ef0 = 0;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/DirectiveParser.cpp"
                      ,100,"bool Refal2::CDirectiveParser::StartParseIfDirective()");
      }
      this_local._7_1_ = true;
    }
    return this_local._7_1_;
  }
  __assert_fail("token.type == TT_Word",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/DirectiveParser.cpp"
                ,0x47,"bool Refal2::CDirectiveParser::StartParseIfDirective()");
}

Assistant:

bool CDirectiveParser::StartParseIfDirective()
{
	assert( token.type == TT_Word );
	TDirectiveType directiveType = findDirective( token.word );
	if( directiveType != DT_None ) {
		CRuleParser::EndFunction();
		CParsingElementState::Reset();
		token.Move( directive );
		switch( directiveType ) {
			case DT_Start:
				state = S_Simple;
				CModuleBuilder::StartModule( directive );
				break;
			case DT_End:
				state = S_Simple;
				CModuleBuilder::EndModule( directive );
				break;
			case DT_Empty:
				state = S_OneName;
				handler = &CDirectiveParser::addEmpty;
				break;
			case DT_External:
				state = S_TwoNames;
				handler = &CDirectiveParser::addExternal;
				break;
			case DT_Entry:
				state = S_TwoNames;
				handler = &CDirectiveParser::addEntry;
				break;
			case DT_None:
			default:
				assert( false );
				break;
		}
		return true;
	}
	return false;
}